

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_rounding.cpp
# Opt level: O1

int32_t __thiscall
icu_63::number::impl::RoundingImpl::chooseMultiplierAndApply
          (RoundingImpl *this,DecimalQuantity *input,MultiplierProducer *producer,UErrorCode *status
          )

{
  bool bVar1;
  uint uVar2;
  int delta;
  int32_t iVar3;
  int iVar4;
  
  uVar2 = DecimalQuantity::getMagnitude(input);
  delta = (*producer->_vptr_MultiplierProducer[2])(producer,(ulong)uVar2);
  DecimalQuantity::adjustMagnitude(input,delta);
  apply(this,input,status);
  bVar1 = DecimalQuantity::isZero(input);
  if ((!bVar1) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    iVar3 = DecimalQuantity::getMagnitude(input);
    if (iVar3 != delta + uVar2) {
      iVar4 = (*producer->_vptr_MultiplierProducer[2])(producer,(ulong)(uVar2 + 1));
      if (iVar4 - delta != 0) {
        DecimalQuantity::adjustMagnitude(input,iVar4 - delta);
        apply(this,input,status);
        delta = iVar4;
      }
    }
  }
  return delta;
}

Assistant:

int32_t
RoundingImpl::chooseMultiplierAndApply(impl::DecimalQuantity &input, const impl::MultiplierProducer &producer,
                                  UErrorCode &status) {
    // Do not call this method with zero.
    U_ASSERT(!input.isZero());

    // Perform the first attempt at rounding.
    int magnitude = input.getMagnitude();
    int multiplier = producer.getMultiplier(magnitude);
    input.adjustMagnitude(multiplier);
    apply(input, status);

    // If the number rounded to zero, exit.
    if (input.isZero() || U_FAILURE(status)) {
        return multiplier;
    }

    // If the new magnitude after rounding is the same as it was before rounding, then we are done.
    // This case applies to most numbers.
    if (input.getMagnitude() == magnitude + multiplier) {
        return multiplier;
    }

    // If the above case DIDN'T apply, then we have a case like 99.9 -> 100 or 999.9 -> 1000:
    // The number rounded up to the next magnitude. Check if the multiplier changes; if it doesn't,
    // we do not need to make any more adjustments.
    int _multiplier = producer.getMultiplier(magnitude + 1);
    if (multiplier == _multiplier) {
        return multiplier;
    }

    // We have a case like 999.9 -> 1000, where the correct output is "1K", not "1000".
    // Fix the magnitude and re-apply the rounding strategy.
    input.adjustMagnitude(_multiplier - multiplier);
    apply(input, status);
    return _multiplier;
}